

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

Char __thiscall cppforth::Forth::dataSpaceAt(Forth *this,Cell index)

{
  bool bVar1;
  reference pVVar2;
  reference pVVar3;
  reference pvVar4;
  __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
  local_30;
  iterator itend;
  iterator it;
  Cell index_local;
  Forth *this_local;
  
  itend = std::
          vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
          ::begin(&this->VirtualMemory);
  local_30._M_current =
       (VirtualMemorySegment *)
       std::
       vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
       ::end(&this->VirtualMemory);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
                      (&itend,&local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return '\0';
    }
    pVVar2 = __gnu_cxx::
             __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
             ::operator*(&itend);
    if ((pVVar2->start <= index) &&
       (pVVar2 = __gnu_cxx::
                 __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
                 ::operator*(&itend), index < pVVar2->end)) break;
    __gnu_cxx::
    __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
    ::operator++(&itend);
  }
  pVVar2 = __gnu_cxx::
           __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
           ::operator*(&itend);
  pVVar3 = __gnu_cxx::
           __normal_iterator<cppforth::Forth::VirtualMemorySegment_*,_std::vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>_>
           ::operator*(&itend);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (&pVVar2->segment,(ulong)(index - pVVar3->start));
  return *pvVar4;
}

Assistant:

Char dataSpaceAt(Cell index){
			for (auto it = VirtualMemory.begin(), itend=VirtualMemory.end(); it != itend ; ++it){
				if ((*it).start <= index && (*it).end > index){
					return (*it).segment.at(index - (*it).start);
				}
			}
			return Char(0); // all memory is filled by 0x00
		}